

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

string * FormatISO8601Date_abi_cxx11_(string *__return_storage_ptr__,int64_t nTime)

{
  year_month_day yVar1;
  long lVar2;
  uint *in_R9;
  long in_FS_OFFSET;
  uint local_28;
  uint local_24;
  days local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (nTime / 0x15180) * 0x15180;
  local_20.__r = nTime / 0x15180 - (ulong)(lVar2 - nTime != 0 && nTime <= lVar2);
  yVar1 = std::chrono::year_month_day::_S_from_days(&local_20);
  local_28 = (uint)yVar1 >> 0x18;
  local_20.__r._0_4_ = (int)yVar1._M_y._M_y._M_y;
  local_24 = (uint)yVar1 >> 0x10 & 0xff;
  tinyformat::format<int,unsigned_int,unsigned_int>
            (__return_storage_ptr__,(tinyformat *)"%04i-%02u-%02u",(char *)&local_20,
             (int *)&local_24,&local_28,in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatISO8601Date(int64_t nTime)
{
    const std::chrono::sys_seconds secs{std::chrono::seconds{nTime}};
    const auto days{std::chrono::floor<std::chrono::days>(secs)};
    const std::chrono::year_month_day ymd{days};
    return strprintf("%04i-%02u-%02u", signed{ymd.year()}, unsigned{ymd.month()}, unsigned{ymd.day()});
}